

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_contains_range(roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  _Bool _Var1;
  container_t *pcVar2;
  ulong in_RDX;
  ulong in_RSI;
  roaring_array_t *in_RDI;
  int32_t i;
  container_t *c;
  uint8_t type;
  uint32_t lb_re;
  uint32_t lb_rs;
  int32_t ie;
  int32_t is;
  int32_t hlc_sz;
  int32_t span;
  uint16_t hb_re;
  uint16_t hb_rs;
  undefined7 in_stack_ffffffffffffffa8;
  uint8_t in_stack_ffffffffffffffaf;
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  int iVar3;
  roaring_bitmap_t *in_stack_ffffffffffffffb8;
  uint8_t local_3d;
  int local_3c;
  uint local_38;
  int32_t local_34;
  int local_30;
  int32_t local_2c;
  int local_28;
  ushort local_24;
  ushort local_22;
  ulong local_20;
  ulong local_18;
  roaring_array_t *local_10;
  _Bool local_1;
  
  local_20 = in_RDX;
  if (0xffffffff < in_RDX) {
    local_20 = 0x100000000;
  }
  if (in_RSI < local_20) {
    if (local_20 - in_RSI == 1) {
      local_1 = roaring_bitmap_contains(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
    }
    else {
      local_22 = (ushort)(in_RSI >> 0x10);
      local_24 = (ushort)(local_20 - 1 >> 0x10);
      local_28 = (uint)local_24 - (uint)local_22;
      local_18 = in_RSI;
      local_10 = in_RDI;
      local_2c = ra_get_size(in_RDI);
      if (local_2c < local_28 + 1) {
        local_1 = false;
      }
      else {
        local_30 = ra_get_index((roaring_array_t *)
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0);
        local_34 = ra_get_index((roaring_array_t *)
                                CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),0);
        if ((((local_34 < 0) || (local_30 < 0)) || (local_34 - local_30 != local_28)) ||
           (local_2c <= local_34)) {
          local_1 = false;
        }
        else {
          local_38 = (uint)local_18 & 0xffff;
          local_3c = ((int)local_20 - 1U & 0xffff) + 1;
          pcVar2 = ra_get_container_at_index(local_10,(uint16_t)local_30,&local_3d);
          if (local_22 == local_24) {
            local_1 = container_contains_range
                                (pcVar2,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                                 in_stack_ffffffffffffffaf);
          }
          else {
            _Var1 = container_contains_range
                              (pcVar2,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                               in_stack_ffffffffffffffaf);
            if (_Var1) {
              pcVar2 = ra_get_container_at_index(local_10,(uint16_t)local_34,&local_3d);
              _Var1 = container_contains_range
                                (pcVar2,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                                 in_stack_ffffffffffffffaf);
              iVar3 = local_30;
              if (_Var1) {
                do {
                  iVar3 = iVar3 + 1;
                  if (local_34 <= iVar3) {
                    return true;
                  }
                  ra_get_container_at_index(local_10,(uint16_t)iVar3,&local_3d);
                  _Var1 = container_is_full((container_t *)
                                            CONCAT17(in_stack_ffffffffffffffaf,
                                                     in_stack_ffffffffffffffa8),'\0');
                } while (_Var1);
                local_1 = false;
              }
              else {
                local_1 = false;
              }
            }
            else {
              local_1 = false;
            }
          }
        }
      }
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool roaring_bitmap_contains_range(const roaring_bitmap_t *r,
                                   uint64_t range_start, uint64_t range_end) {
    if (range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }
    if (range_start >= range_end)
        return true;  // empty range are always contained!
    if (range_end - range_start == 1)
        return roaring_bitmap_contains(r, (uint32_t)range_start);
    uint16_t hb_rs = (uint16_t)(range_start >> 16);
    uint16_t hb_re = (uint16_t)((range_end - 1) >> 16);
    const int32_t span = hb_re - hb_rs;
    const int32_t hlc_sz = ra_get_size(&r->high_low_container);
    if (hlc_sz < span + 1) {
        return false;
    }
    int32_t is = ra_get_index(&r->high_low_container, hb_rs);
    int32_t ie = ra_get_index(&r->high_low_container, hb_re);
    if ((ie < 0) || (is < 0) || ((ie - is) != span) || ie >= hlc_sz) {
        return false;
    }
    const uint32_t lb_rs = range_start & 0xFFFF;
    const uint32_t lb_re = ((range_end - 1) & 0xFFFF) + 1;
    uint8_t type;
    container_t *c =
        ra_get_container_at_index(&r->high_low_container, (uint16_t)is, &type);
    if (hb_rs == hb_re) {
        return container_contains_range(c, lb_rs, lb_re, type);
    }
    if (!container_contains_range(c, lb_rs, 1 << 16, type)) {
        return false;
    }
    c = ra_get_container_at_index(&r->high_low_container, (uint16_t)ie, &type);
    if (!container_contains_range(c, 0, lb_re, type)) {
        return false;
    }
    for (int32_t i = is + 1; i < ie; ++i) {
        c = ra_get_container_at_index(&r->high_low_container, (uint16_t)i,
                                      &type);
        if (!container_is_full(c, type)) {
            return false;
        }
    }
    return true;
}